

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionSettings.cpp
# Opt level: O0

void __thiscall
FIX::SessionSettings::set(SessionSettings *this,SessionID *sessionID,Dictionary *settings)

{
  bool bVar1;
  ConfigError *this_00;
  StringField *pSVar2;
  string *psVar3;
  mapped_type *this_01;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  undefined1 local_6d;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Dictionary *local_20;
  Dictionary *settings_local;
  SessionID *sessionID_local;
  SessionSettings *this_local;
  
  local_20 = settings;
  settings_local = (Dictionary *)sessionID;
  sessionID_local = (SessionID *)this;
  bVar1 = has(this,sessionID);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"BeginString",&local_91);
    pSVar2 = &SessionID::getBeginString((SessionID *)settings_local)->super_StringField;
    psVar3 = StringField::operator_cast_to_string_(pSVar2);
    Dictionary::setString(settings,&local_90,psVar3);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"SenderCompID",&local_b9)
    ;
    pSVar2 = &SessionID::getSenderCompID((SessionID *)settings_local)->super_StringField;
    psVar3 = StringField::operator_cast_to_string_(pSVar2);
    Dictionary::setString(settings,&local_b8,psVar3);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"TargetCompID",&local_e1)
    ;
    pSVar2 = &SessionID::getTargetCompID((SessionID *)settings_local)->super_StringField;
    psVar3 = StringField::operator_cast_to_string_(pSVar2);
    Dictionary::setString(settings,&local_e0,psVar3);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    Dictionary::merge(settings,&this->m_defaults);
    validate(this,settings);
    this_01 = std::
              map<FIX::SessionID,_FIX::Dictionary,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
              ::operator[](&this->m_settings,(key_type *)settings_local);
    Dictionary::operator=(this_01,settings);
    return;
  }
  local_6d = 1;
  this_00 = (ConfigError *)__cxa_allocate_exception(0x50);
  SessionID::toString_abi_cxx11_(&local_60,(SessionID *)settings_local);
  std::operator+(&local_40,"Duplicate Session ",&local_60);
  ConfigError::ConfigError(this_00,&local_40);
  local_6d = 0;
  __cxa_throw(this_00,&ConfigError::typeinfo,ConfigError::~ConfigError);
}

Assistant:

EXCEPT(ConfigError) {
  if (has(sessionID)) {
    throw ConfigError("Duplicate Session " + sessionID.toString());
  }

  settings.setString(BEGINSTRING, sessionID.getBeginString());
  settings.setString(SENDERCOMPID, sessionID.getSenderCompID());
  settings.setString(TARGETCOMPID, sessionID.getTargetCompID());

  settings.merge(m_defaults);
  validate(settings);
  m_settings[sessionID] = settings;
}